

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O0

void final_filter(int32_t *dst,int dst_stride,int32_t *A,int32_t *B,int buf_stride,void *dgd8,
                 int dgd_stride,int width,int height,int highbd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  __m256i v_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 in_RCX;
  int32_t *in_RDX;
  long in_R9;
  ulong in_XMM0_Qa;
  ulong uVar7;
  ulong uVar8;
  undefined8 in_XMM0_Qb;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 in_YMM0_H;
  undefined8 uVar11;
  undefined8 in_register_00001218;
  undefined8 uVar12;
  int in_stack_00000008;
  __m256i w;
  __m256i v;
  __m256i src;
  __m128i raw;
  __m256i b;
  __m256i a;
  int j;
  int i;
  uint8_t *dgd_real;
  __m256i rounding;
  int nb;
  undefined8 uVar13;
  uint in_stack_fffffffffffffd30;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 uStack_2c8;
  void *in_stack_fffffffffffffd50;
  long local_2a8;
  ulong local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  int local_1d0;
  int local_1cc;
  
  round_for_shift(in_stack_fffffffffffffd30);
  local_2a8 = in_R9;
  if (height != 0) {
    local_2a8 = in_R9 << 1;
  }
  local_2a0 = in_XMM0_Qa;
  uStack_298 = in_XMM0_Qb;
  uStack_290 = in_YMM0_H;
  uStack_288 = in_register_00001218;
  for (local_1cc = 0; local_1cc < width; local_1cc = local_1cc + 1) {
    for (local_1d0 = 0; local_1d0 < dgd_stride; local_1d0 = local_1d0 + 8) {
      cross_sum(in_RDX,(int)((ulong)in_RCX >> 0x20));
      uVar7 = local_2a0;
      uVar9 = uStack_298;
      uVar11 = uStack_290;
      uVar12 = uStack_288;
      cross_sum(in_RDX,(int)((ulong)in_RCX >> 0x20));
      uVar8 = uVar7;
      uVar10 = uVar9;
      xx_loadu_128((void *)(local_2a8 +
                           (local_1cc * in_stack_00000008 + local_1d0 << ((byte)height & 0x1f))));
      if (height == 0) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar8;
        auVar2 = vpmovzxbd_avx2(auVar1);
        uVar10 = auVar2._0_8_;
        uVar13 = auVar2._8_8_;
        uVar14 = auVar2._16_4_;
        uVar15 = auVar2._20_4_;
        uStack_2c8 = auVar2._24_8_;
      }
      else {
        auVar3._8_8_ = uVar10;
        auVar3._0_8_ = uVar8;
        auVar2 = vpmovzxwd_avx2(auVar3);
        uVar10 = auVar2._0_8_;
        uVar13 = auVar2._8_8_;
        uVar14 = auVar2._16_4_;
        uVar15 = auVar2._20_4_;
        uStack_2c8 = auVar2._24_8_;
      }
      auVar2._20_4_ = uVar15;
      auVar2._16_4_ = uVar14;
      auVar6._8_8_ = uStack_298;
      auVar6._0_8_ = local_2a0;
      auVar6._16_8_ = uStack_290;
      auVar6._24_8_ = uStack_288;
      auVar2._8_8_ = uVar13;
      auVar2._0_8_ = uVar10;
      auVar2._24_8_ = uStack_2c8;
      auVar2 = vpmaddwd_avx2(auVar6,auVar2);
      auVar5._8_8_ = uVar9;
      auVar5._0_8_ = uVar7;
      auVar5._16_8_ = uVar11;
      auVar5._24_8_ = uVar12;
      auVar2 = vpaddd_avx2(auVar2,auVar5);
      auVar4._8_8_ = in_XMM0_Qb;
      auVar4._0_8_ = in_XMM0_Qa;
      auVar4._16_8_ = in_YMM0_H;
      auVar4._24_8_ = in_register_00001218;
      auVar2 = vpaddd_avx2(auVar2,auVar4);
      auVar2 = vpsrad_avx2(auVar2,ZEXT416(9));
      local_2a0 = auVar2._0_8_;
      uStack_298 = auVar2._8_8_;
      uStack_290 = auVar2._16_8_;
      uStack_288 = auVar2._24_8_;
      v_00[1] = uVar10;
      v_00[0] = 0xa392dd;
      v_00[2] = uVar13;
      v_00[3]._0_4_ = uVar14;
      v_00[3]._4_4_ = uVar15;
      yy_storeu_256(in_stack_fffffffffffffd50,v_00);
    }
  }
  return;
}

Assistant:

static void final_filter(int32_t *dst, int dst_stride, const int32_t *A,
                         const int32_t *B, int buf_stride, const void *dgd8,
                         int dgd_stride, int width, int height, int highbd) {
  const int nb = 5;
  const __m256i rounding =
      round_for_shift(SGRPROJ_SGR_BITS + nb - SGRPROJ_RST_BITS);
  const uint8_t *dgd_real =
      highbd ? (const uint8_t *)CONVERT_TO_SHORTPTR(dgd8) : dgd8;

  for (int i = 0; i < height; ++i) {
    for (int j = 0; j < width; j += 8) {
      const __m256i a = cross_sum(A + i * buf_stride + j, buf_stride);
      const __m256i b = cross_sum(B + i * buf_stride + j, buf_stride);

      const __m128i raw =
          xx_loadu_128(dgd_real + ((i * dgd_stride + j) << highbd));
      const __m256i src =
          highbd ? _mm256_cvtepu16_epi32(raw) : _mm256_cvtepu8_epi32(raw);

      __m256i v = _mm256_add_epi32(_mm256_madd_epi16(a, src), b);
      __m256i w = _mm256_srai_epi32(_mm256_add_epi32(v, rounding),
                                    SGRPROJ_SGR_BITS + nb - SGRPROJ_RST_BITS);

      yy_storeu_256(dst + i * dst_stride + j, w);
    }
  }
}